

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putcontig8bitYCbCr12tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  TIFFRGBAImage *pTVar1;
  uchar *puVar2;
  long lVar3;
  uint32_t *puVar4;
  long lVar5;
  long lVar6;
  uint32_t g;
  uint32_t local_88;
  uint32_t local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  ulong local_70;
  TIFFRGBAImage *local_68;
  uchar *local_60;
  uint32_t *local_58;
  long local_50;
  long local_48;
  uint32_t *local_40;
  long local_38;
  
  local_70 = (ulong)w;
  puVar4 = cp + local_70 + (long)toskew;
  local_48 = (long)(int)(w + toskew * 2) * -4;
  local_50 = -(long)(fromskew << 2);
  local_68 = img;
  while (pTVar1 = local_68, 1 < h) {
    lVar6 = 0;
    lVar3 = local_50;
    lVar5 = local_48;
    local_7c = h;
    local_60 = pp;
    local_58 = cp;
    local_40 = puVar4;
    do {
      puVar2 = local_60;
      pTVar1 = local_68;
      local_74 = (uint)local_60[lVar6 * 4 + 2];
      local_78 = (uint)local_60[lVar6 * 4 + 3];
      local_38 = lVar3;
      TIFFYCbCrtoRGB(local_68->ycbcr,(uint)local_60[lVar6 * 4],local_74,local_78,&local_80,&local_84
                     ,&local_88);
      local_58[lVar6] = local_88 << 0x10 | 0xff000000 | local_84 << 8 | local_80;
      TIFFYCbCrtoRGB(pTVar1->ycbcr,(uint)puVar2[lVar6 * 4 + 1],local_74,local_78,&local_80,&local_84
                     ,&local_88);
      local_40[lVar6] = local_88 << 0x10 | 0xff000000 | local_84 << 8 | local_80;
      lVar5 = lVar5 + -4;
      lVar6 = lVar6 + 1;
      lVar3 = local_38 + -4;
    } while ((int)local_70 != (int)lVar6);
    cp = (uint32_t *)((long)local_58 - lVar5);
    puVar4 = (uint32_t *)((long)local_40 - lVar5);
    pp = local_60 + -lVar3;
    h = local_7c - 2;
  }
  if (h == 1) {
    lVar3 = 0;
    do {
      TIFFYCbCrtoRGB(pTVar1->ycbcr,(uint)pp[lVar3 * 4],(uint)pp[lVar3 * 4 + 2],
                     (uint)pp[lVar3 * 4 + 3],&local_80,&local_84,&local_88);
      cp[lVar3] = local_84 << 8 | local_80 | local_88 << 0x10 | 0xff000000;
      lVar3 = lVar3 + 1;
    } while ((int)local_70 != (int)lVar3);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr12tile)
{
    uint32_t *cp2;
    int32_t incr = 2 * toskew + w;
    (void)y;
    fromskew = (fromskew / 1) * (1 * 2 + 2);
    cp2 = cp + w + toskew;
    while (h >= 2)
    {
        x = w;
        do
        {
            uint32_t Cb = pp[2];
            uint32_t Cr = pp[3];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp2[0], pp[1]);
            cp++;
            cp2++;
            pp += 4;
        } while (--x);
        cp += incr;
        cp2 += incr;
        pp += fromskew;
        h -= 2;
    }
    if (h == 1)
    {
        x = w;
        do
        {
            uint32_t Cb = pp[2];
            uint32_t Cr = pp[3];
            YCbCrtoRGB(cp[0], pp[0]);
            cp++;
            pp += 4;
        } while (--x);
    }
}